

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O0

void __thiscall
OpenCorruptStore_HeaderFooterTooLarge_Test::~OpenCorruptStore_HeaderFooterTooLarge_Test
          (OpenCorruptStore_HeaderFooterTooLarge_Test *this)

{
  OpenCorruptStore_HeaderFooterTooLarge_Test *this_local;
  
  ~OpenCorruptStore_HeaderFooterTooLarge_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F (OpenCorruptStore, HeaderFooterTooLarge) {
    auto too_large = pstore::typed_address<pstore::trailer>::make (
        (UINT64_C (1) << (pstore::address::offset_number_bits +
                          pstore::address::segment_number_bits)) -
        1U);
    this->get_header ()->footer_pos = too_large;
    this->check_database_open (pstore::error_code::header_corrupt);
}